

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedNames.cpp
# Opt level: O0

void __thiscall wasm::RemoveUnusedNames::visitLoop(RemoveUnusedNames *this,Loop *curr)

{
  bool bVar1;
  Loop *curr_local;
  RemoveUnusedNames *this_local;
  
  handleBreakTarget(this,&curr->name);
  bVar1 = IString::is(&(curr->name).super_IString);
  if ((!bVar1) &&
     (bVar1 = wasm::Type::operator==
                        (&curr->body->type,
                         &(curr->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression
                          .type), bVar1)) {
    Walker<wasm::RemoveUnusedNames,_wasm::UnifiedExpressionVisitor<wasm::RemoveUnusedNames,_void>_>
    ::replaceCurrent(&(this->
                      super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedNames,_wasm::UnifiedExpressionVisitor<wasm::RemoveUnusedNames,_void>_>_>
                      ).
                      super_PostWalker<wasm::RemoveUnusedNames,_wasm::UnifiedExpressionVisitor<wasm::RemoveUnusedNames,_void>_>
                      .
                      super_Walker<wasm::RemoveUnusedNames,_wasm::UnifiedExpressionVisitor<wasm::RemoveUnusedNames,_void>_>
                     ,curr->body);
  }
  return;
}

Assistant:

void visitLoop(Loop* curr) {
    handleBreakTarget(curr->name);
    if (!curr->name.is() && curr->body->type == curr->type) {
      replaceCurrent(curr->body);
    }
  }